

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PSound::ReadValue(PSound *this,FArchive *ar,void *addr)

{
  char *name;
  FSoundID local_58 [4];
  FString local_48;
  FString str_1;
  char *str;
  FSoundID *pFStack_28;
  BYTE tag;
  void *addr_local;
  FArchive *ar_local;
  PSound *this_local;
  
  pFStack_28 = (FSoundID *)addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,(BYTE *)((long)&str + 7));
  if (str._7_1_ == 0xd) {
    name = FArchive::ReadName((FArchive *)addr_local);
    FSoundID::FSoundID((FSoundID *)((long)&str_1.Chars + 4),name);
    FSoundID::operator=(pFStack_28,(FSoundID *)((long)&str_1.Chars + 4));
  }
  else {
    if (str._7_1_ != 0xc) {
      PType::SkipValue((FArchive *)addr_local,(uint)str._7_1_);
      return false;
    }
    FString::FString(&local_48);
    FArchive::operator<<((FArchive *)addr_local,&local_48);
    FSoundID::FSoundID(local_58,&local_48);
    FSoundID::operator=(pFStack_28,local_58);
    FString::~FString(&local_48);
  }
  return true;
}

Assistant:

bool PSound::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;

	ar << tag;
	if (tag == VAL_Name)
	{
		const char *str = ar.ReadName();
		*(FSoundID *)addr = FSoundID(str);
	}
	else if (tag == VAL_String)
	{
		FString str;
		ar << str;
		*(FSoundID *)addr = FSoundID(str);
	}
	else
	{
		SkipValue(ar, tag);
		return false;
	}
	return true;
}